

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# OperatorExpressions.cpp
# Opt level: O2

void __thiscall
slang::ast::InsideExpression::serializeTo(InsideExpression *this,ASTSerializer *serializer)

{
  pointer ppEVar1;
  size_t sVar2;
  long lVar3;
  string_view name;
  
  ASTSerializer::write(serializer,4,"left",(size_t)this->left_);
  if ((this->rangeList_)._M_extent._M_extent_value != 0) {
    name._M_str = "rangeList";
    name._M_len = 9;
    ASTSerializer::startArray(serializer,name);
    ppEVar1 = (this->rangeList_)._M_ptr;
    sVar2 = (this->rangeList_)._M_extent._M_extent_value;
    for (lVar3 = 0; sVar2 << 3 != lVar3; lVar3 = lVar3 + 8) {
      ASTSerializer::serialize(serializer,*(Expression **)((long)ppEVar1 + lVar3));
    }
    ASTSerializer::endArray(serializer);
    return;
  }
  return;
}

Assistant:

void InsideExpression::serializeTo(ASTSerializer& serializer) const {
    serializer.write("left", left());

    if (!rangeList().empty()) {
        serializer.startArray("rangeList");
        for (auto elem : rangeList())
            serializer.serialize(*elem);
        serializer.endArray();
    }
}